

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

ValueType ToWabtValueType(wasm_valkind_t kind)

{
  ValueType VVar1;
  ValueType VVar2;
  ValueType VVar3;
  ValueType VVar4;
  ValueType VVar5;
  int iVar6;
  undefined7 in_register_00000039;
  undefined8 in_R8;
  undefined8 in_R9;
  
  VVar1.enum_ = ExternRef;
  VVar1.type_index_ = 0;
  iVar6 = (int)CONCAT71(in_register_00000039,kind);
  switch(CONCAT71(in_register_00000039,kind) & 0xffffffff) {
  case 0:
    VVar1.enum_ = I32;
    VVar1.type_index_ = 0;
    break;
  case 1:
    VVar5.enum_ = I64;
    VVar5.type_index_ = 0;
    return VVar5;
  case 2:
    VVar3.enum_ = F32;
    VVar3.type_index_ = 0;
    return VVar3;
  case 3:
    VVar4.enum_ = F64;
    VVar4.type_index_ = 0;
    return VVar4;
  default:
    if (iVar6 != 0x80) {
      if (iVar6 != 0x81) {
        fprintf(_stderr,"CAPI: [%s] unexpected wasm_valkind_t: %d\n","ToWabtValueType",kind,in_R8,
                in_R9,0xffffffef);
        abort();
      }
      VVar2.enum_ = FuncRef;
      VVar2.type_index_ = 0;
      return VVar2;
    }
  }
  return VVar1;
}

Assistant:

static ValueType ToWabtValueType(wasm_valkind_t kind) {
  switch (kind) {
    case WASM_I32:
      return ValueType::I32;
    case WASM_I64:
      return ValueType::I64;
    case WASM_F32:
      return ValueType::F32;
    case WASM_F64:
      return ValueType::F64;
    case WASM_ANYREF:
      return ValueType::ExternRef;
    case WASM_FUNCREF:
      return ValueType::FuncRef;
    default:
      TRACE("unexpected wasm_valkind_t: %d", kind);
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}